

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O1

bool pztopology::TPZPrism::CheckProjectionForSingularity<double>
               (int *side,TPZVec<double> *xiInterior)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  
  iVar2 = *side;
  bVar3 = true;
  if (0xc < iVar2 - 6U) goto switchD_00dbce54_caseD_9;
  dVar4 = *xiInterior->fStore;
  dVar1 = xiInterior->fStore[1];
  switch(iVar2) {
  case 6:
  case 0xc:
  case 0x10:
    if (gTolerance <= ABS(dVar1 + -1.0)) goto switchD_00dbce54_caseD_9;
    goto LAB_00dbce8a;
  case 7:
  case 0xd:
  case 0x11:
    dVar4 = dVar4 + dVar1;
    break;
  case 8:
  case 0xe:
  case 0x12:
    dVar4 = dVar4 + -1.0;
    break;
  default:
    goto switchD_00dbce54_caseD_9;
  }
  if (ABS(dVar4) < gTolerance) {
LAB_00dbce8a:
    bVar3 = false;
  }
switchD_00dbce54_caseD_9:
  if (iVar2 < 0x15) {
    return bVar3;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Cant compute CheckProjectionForSingularity method in TPZPrism class!\nParameter (SIDE) must be between 6 and 19!\nMethod Aborted!\n"
             ,0x80);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzprism.cpp"
             ,0x419);
}

Assistant:

bool TPZPrism::CheckProjectionForSingularity(const int &side, const TPZVec<T> &xiInterior) {
        double zero = pztopology::gTolerance;

        T qsi = xiInterior[0];
        T eta = xiInterior[1];
        T zeta = xiInterior[2];

        bool regularmap = true;
        switch(side)
        {
            case 0:
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
                regularmap = true;
                break;
            case 6://1D
                if(fabs((T)(eta-1.)) < zero) regularmap = false;
                break;
            case 7://1D
                if(fabs((T)(qsi+eta)) < zero) regularmap = false;
                break;
            case 8://1D
                if(fabs((T)(qsi-1.)) < zero) regularmap = false;
                break;
            case 9://1D
            case 10://1D
            case 11://1D
                regularmap = true;
                break;
            case 12://1D
                if(fabs((T)(eta-1.)) < zero) regularmap = false;
                break;
            case 13://1D
                if(fabs((T)(qsi+eta)) < zero) regularmap = false;
                break;
            case 14://1D
                if(fabs((T)(qsi-1.)) < zero) regularmap = false;
                break;
            case 15://2D - triangle
                regularmap = true;
                break;
            case 16://2D - quadrilateral
                if(fabs((T)(eta-1.)) < zero) regularmap = false;
                break;
            case 17://2D - quadrilateral
                if(fabs((T)(qsi+eta)) < zero) regularmap = false;
                break;
            case 18://2D - quadrilateral
                if(fabs((T)(qsi-1.)) < zero) regularmap = false;
                break;
            case 19:
            case 20:
                regularmap = true;
        }
        if(side > 20)
        {
            cout << "Cant compute CheckProjectionForSingularity method in TPZPrism class!\nParameter (SIDE) must be between 6 and 19!\nMethod Aborted!\n";
            DebugStop();
        }
        return regularmap;
    }